

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_test.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_18d2769::LevelTest_TestTargetLevel0_Test::~LevelTest_TestTargetLevel0_Test
          (LevelTest_TestTargetLevel0_Test *this)

{
  LevelTest::~LevelTest(&this->super_LevelTest);
  operator_delete(this);
  return;
}

Assistant:

TEST_P(LevelTest, TestTargetLevel0) {
  // To save run time, we only test speed 4.
  if (cpu_used_ == 4) {
    libaom_test::I420VideoSource video("hantro_collage_w352h288.yuv", 352, 288,
                                       30, 1, 0, 50);
    const int target_level = 0;
    target_level_ = target_level;
    cfg_.rc_target_bitrate = 4000;
    ASSERT_NO_FATAL_FAILURE(RunLoop(&video));
    ASSERT_LE(level_[0], target_level);
  }
}